

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::setTabStopDistance(QTextEdit *this,qreal distance)

{
  QTextDocument *pQVar1;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  qreal qVar2;
  QTextEditPrivate *d;
  QTextOption opt;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 *local_20;
  undefined8 local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QTextEdit *)0x6d578b);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = 0xffffffffffffffff;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document
            ((QWidgetTextControl *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  QTextDocument::defaultTextOption();
  qVar2 = QTextOption::tabStopDistance((QTextOption *)&local_20);
  if (((qVar2 != in_XMM0_Qa) || (NAN(qVar2) || NAN(in_XMM0_Qa))) && (0.0 <= in_XMM0_Qa)) {
    QTextOption::setTabStopDistance((QTextOption *)&local_20,in_XMM0_Qa);
    pQVar1 = QWidgetTextControl::document
                       ((QWidgetTextControl *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QTextDocument::setDefaultTextOption((QTextOption *)pQVar1);
  }
  QTextOption::~QTextOption((QTextOption *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::setTabStopDistance(qreal distance)
{
    Q_D(QTextEdit);
    QTextOption opt = d->control->document()->defaultTextOption();
    if (opt.tabStopDistance() == distance || distance < 0)
        return;
    opt.setTabStopDistance(distance);
    d->control->document()->setDefaultTextOption(opt);
}